

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makePreview.cpp
# Opt level: O2

void makePreview(char *inFileName,char *outFileName,int previewWidth,float exposure,bool verbose)

{
  int iVar1;
  PreviewRgba *pPVar2;
  uchar extraout_AL;
  uchar extraout_AL_00;
  uchar extraout_AL_01;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  ulong uVar7;
  Header *pHVar8;
  undefined7 in_register_00000009;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong sizeX;
  int iVar13;
  int x;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  double local_120;
  long local_118;
  double local_d0;
  TiledOutputFile out;
  InputFile in;
  long local_a0;
  Rgba *local_98;
  Array2D<Imf_3_4::PreviewRgba> previewPixels;
  Header header;
  
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"generating preview image");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  previewPixels._sizeX = 0;
  previewPixels._sizeY = 0;
  previewPixels._data = (PreviewRgba *)0x0;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,inFileName,iVar4);
  piVar6 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  lVar10 = (long)*piVar6;
  iVar4 = piVar6[1];
  uVar9 = piVar6[2];
  iVar1 = piVar6[3];
  fVar16 = (float)Imf_3_4::RgbaInputFile::pixelAspectRatio();
  lVar12 = (int)uVar9 - lVar10;
  lVar11 = lVar12 + 1;
  iVar13 = (iVar1 - iVar4) + 1;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&in,(long)iVar13,lVar11);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            ((Rgba *)&header,(ulong)(local_98 + (((int)~uVar9 + lVar10) * (long)iVar4 - lVar10)),1);
  Imf_3_4::RgbaInputFile::readPixels((int)&header,iVar4);
  uVar9 = (uint)((float)previewWidth * ((float)iVar13 / (fVar16 * (float)(int)lVar11)) + 0.5);
  sizeX = 1;
  if (1 < (int)uVar9) {
    sizeX = (ulong)uVar9;
  }
  Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::resizeErase(&previewPixels,sizeX,(long)previewWidth);
  if (previewWidth < 2) {
    local_120 = 1.0;
  }
  else {
    local_120 = (double)(int)lVar12 / (double)(previewWidth + -1);
  }
  if ((int)uVar9 < 2) {
    local_d0 = 1.0;
  }
  else {
    local_d0 = (double)(iVar1 - iVar4) / (double)(int)((uint)sizeX - 1);
  }
  fVar17 = exposure + 2.47393;
  fVar16 = 20.0;
  if (fVar17 <= 20.0) {
    fVar16 = fVar17;
  }
  fVar16 = exp2f((float)(-(uint)(fVar17 < -20.0) & 0xc1a00000 |
                        ~-(uint)(fVar17 < -20.0) & (uint)fVar16));
  local_118 = 0;
  uVar15 = 0;
  if (0 < previewWidth) {
    uVar15 = (ulong)(uint)previewWidth;
  }
  for (uVar7 = 0; uVar7 != sizeX; uVar7 = uVar7 + 1) {
    for (uVar14 = 0; pPVar2 = previewPixels._data, uVar15 != uVar14; uVar14 = uVar14 + 1) {
      lVar12 = previewPixels._sizeY * local_118;
      lVar11 = local_a0 * (int)((double)(int)uVar7 * local_d0 + 0.5);
      lVar10 = (long)(int)((double)(int)uVar14 * local_120 + 0.5);
      anon_unknown.dwarf_4cc0::gamma
                ((anon_unknown_dwarf_4cc0 *)(ulong)local_98[lVar11 + lVar10].r._h,
                 (double)(ulong)(uint)fVar16);
      (&pPVar2[uVar14].r)[lVar12] = extraout_AL;
      anon_unknown.dwarf_4cc0::gamma
                ((anon_unknown_dwarf_4cc0 *)(ulong)local_98[lVar11 + lVar10].g._h,
                 (double)(ulong)(uint)fVar16);
      (&pPVar2[uVar14].g)[lVar12] = extraout_AL_00;
      anon_unknown.dwarf_4cc0::gamma
                ((anon_unknown_dwarf_4cc0 *)(ulong)local_98[lVar11 + lVar10].b._h,
                 (double)(ulong)(uint)fVar16);
      (&pPVar2[uVar14].b)[lVar12] = extraout_AL_01;
      fVar18 = *(float *)(_imath_half_to_float_table + (ulong)local_98[lVar11 + lVar10].a._h * 4) *
               255.0;
      fVar17 = 255.0;
      if (fVar18 <= 255.0) {
        fVar17 = fVar18;
      }
      (&pPVar2[uVar14].a)[lVar12] =
           (uchar)(int)(float)(-(uint)(fVar18 < 0.0) & 0x3f000000 |
                              ~-(uint)(fVar18 < 0.0) & (uint)(fVar17 + 0.5));
    }
    local_118 = local_118 + 4;
  }
  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&in);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(&in,inFileName,iVar4);
  pHVar8 = (Header *)Imf_3_4::InputFile::header();
  Imf_3_4::Header::Header(&header,pHVar8);
  Imf_3_4::PreviewImage::PreviewImage
            ((PreviewImage *)&out,previewWidth,(uint)sizeX,previewPixels._data);
  Imf_3_4::Header::setPreviewImage((PreviewImage *)&header);
  Imf_3_4::PreviewImage::~PreviewImage((PreviewImage *)&out);
  if (verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"copying ");
    poVar5 = std::operator<<(poVar5,inFileName);
    poVar5 = std::operator<<(poVar5," to ");
    poVar5 = std::operator<<(poVar5,outFileName);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  cVar3 = Imf_3_4::Header::hasTileDescription();
  if (cVar3 == '\0') {
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::OutputFile::OutputFile((OutputFile *)&out,outFileName,&header,iVar4);
    Imf_3_4::OutputFile::copyPixels((InputFile *)&out);
    Imf_3_4::OutputFile::~OutputFile((OutputFile *)&out);
  }
  else {
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledOutputFile::TiledOutputFile(&out,outFileName,&header,iVar4);
    Imf_3_4::TiledOutputFile::copyPixels((InputFile *)&out);
    Imf_3_4::TiledOutputFile::~TiledOutputFile(&out);
  }
  if (verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"done.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  Imf_3_4::Header::~Header(&header);
  Imf_3_4::InputFile::~InputFile(&in);
  Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::~Array2D(&previewPixels);
  return;
}

Assistant:

void
makePreview (
    const char inFileName[],
    const char outFileName[],
    int        previewWidth,
    float      exposure,
    bool       verbose)
{
    if (verbose) cout << "generating preview image" << endl;

    Array2D<PreviewRgba> previewPixels;
    int                  previewHeight;

    generatePreview (
        inFileName, exposure, previewWidth, previewHeight, previewPixels);

    InputFile in (inFileName);
    Header    header = in.header ();

    header.setPreviewImage (
        PreviewImage (previewWidth, previewHeight, &previewPixels[0][0]));

    if (verbose)
        cout << "copying " << inFileName << " to " << outFileName << endl;

    if (header.hasTileDescription ())
    {
        TiledOutputFile out (outFileName, header);
        out.copyPixels (in);
    }
    else
    {
        OutputFile out (outFileName, header);
        out.copyPixels (in);
    }

    if (verbose) cout << "done." << endl;
}